

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     unguarded_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedBinaryCover()::__0>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_8991fb9c comp)

{
  bool bVar1;
  reference piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *this;
  T tmp;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> sift_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> sift;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> cur;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  int local_34;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  anon_class_8_1_8991fb9c local_18 [3];
  
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  if (!bVar1) {
    local_20 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffa8), bVar1) {
      local_28._M_current = local_20._M_current;
      local_30 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator-((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_28);
      in_stack_ffffffffffffffbc = *piVar2;
      piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_30);
      bVar1 = HighsCutGeneration::separateLiftedMixedBinaryCover::anon_class_8_1_8991fb9c::
              operator()(local_18,in_stack_ffffffffffffffbc,*piVar2);
      if (bVar1) {
        piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_28);
        local_34 = *piVar2;
        do {
          piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_30);
          in_stack_ffffffffffffffb8 = *piVar2;
          local_40 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator--((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                in_stack_ffffffffffffffb4);
          piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_40);
          *piVar2 = in_stack_ffffffffffffffb8;
          in_stack_ffffffffffffffb4 = local_34;
          this = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator--(&local_30);
          piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(this);
          bVar1 = HighsCutGeneration::separateLiftedMixedBinaryCover::anon_class_8_1_8991fb9c::
                  operator()(local_18,in_stack_ffffffffffffffb4,*piVar2);
        } while (bVar1);
        in_stack_ffffffffffffffb0 = local_34;
        piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_28);
        *piVar2 = in_stack_ffffffffffffffb0;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_20);
    }
  }
  return;
}

Assistant:

inline void unguarded_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return;

        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
            }
        }
    }